

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O0

bool anon_unknown.dwarf_140f6::verifyResult
               (Result *result,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *unparsedArguments)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __l_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  bool bVar1;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[5]> _Var2;
  __type _Var3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar10;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar11;
  size_type sVar12;
  size_type sVar13;
  _Base_ptr *__lhs_00;
  pointer ppVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a88;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_970;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7d8;
  _Self local_7a8;
  _Self local_7a0;
  const_iterator ki;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ke;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  iterator local_6c8;
  size_type local_6c0;
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6b2;
  less<std::basic_string_view<char,_std::char_traits<char>_>_> local_6b1;
  string_view local_6b0;
  string_view local_6a0;
  string_view local_690;
  string_view local_680;
  string_view local_670;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_660;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_658;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_628;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_598;
  undefined1 local_568 [18];
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_556;
  undefined1 local_555;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_554;
  undefined1 local_553;
  allocator<char> local_552;
  allocator<char> local_551;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  string local_528 [32];
  iterator local_508;
  size_type local_500;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4db;
  undefined1 local_4da;
  allocator<char> local_4d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  iterator local_4b0;
  size_type local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_488;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_480;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_448;
  iterator local_410;
  size_type local_408;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_3ff;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3fe [2];
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3fc [2];
  allocator<char> local_3fa;
  allocator<char> local_3f9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  string local_3d0 [32];
  iterator local_3b0;
  size_type local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_383;
  undefined1 local_382;
  allocator<char> local_381;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  iterator local_358;
  size_type local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f0;
  iterator local_2b8;
  size_type local_2b0;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_2a1;
  basic_string_view<char,_std::char_traits<char>_> local_2a0 [22];
  iterator local_140;
  size_type local_138;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_12b;
  undefined1 local_12a;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  iterator local_100;
  size_type local_f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ec [2];
  allocator<char> local_ea;
  allocator<char> local_e9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  iterator local_a0;
  size_type local_98;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f [2];
  allocator<char> local_8d [20];
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unparsedArguments_local;
  Result *result_local;
  
  local_20 = (undefined1  [8])unparsedArguments;
  unparsedArguments_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)result;
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::foobar_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::foobar_abi_cxx11_), iVar4 != 0)) {
    local_8f[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )0x1;
    local_78 = &local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo",&local_79);
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"bar",local_8d);
    local_8f[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )0x0;
    local_30 = &local_70;
    local_28 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(local_8f);
    __l_10._M_len = local_28;
    __l_10._M_array = local_30;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&(anonymous_namespace)::
              verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::foobar_abi_cxx11_,__l_10,local_8f);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(local_8f);
    local_7d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
    do {
      local_7d8 = local_7d8 + -1;
      std::__cxx11::string::~string((string *)local_7d8);
    } while (local_7d8 != &local_70);
    std::allocator<char>::~allocator(local_8d);
    std::allocator<char>::~allocator(&local_79);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,
                 &(anonymous_namespace)::
                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::foobar_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::foobar_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::barfoo_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::barfoo_abi_cxx11_), iVar4 != 0)) {
    local_ec[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )0x1;
    local_e9._1_8_ = &local_e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"bar",local_e9);
    local_e9._1_8_ = local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"foo",&local_ea);
    local_ec[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   )0x0;
    local_a0 = &local_e0;
    local_98 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(local_ec);
    __l_09._M_len = local_98;
    __l_09._M_array = local_a0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&(anonymous_namespace)::
              verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::barfoo_abi_cxx11_,__l_09,local_ec);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(local_ec);
    local_818 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0;
    do {
      local_818 = local_818 + -1;
      std::__cxx11::string::~string((string *)local_818);
    } while (local_818 != &local_e0);
    std::allocator<char>::~allocator(&local_ea);
    std::allocator<char>::~allocator(local_e9);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,
                 &(anonymous_namespace)::
                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::barfoo_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::barfoo_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::unbound_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::unbound_abi_cxx11_), iVar4 != 0)) {
    local_12a = 1;
    local_128 = &local_120;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"unbound",&local_129);
    local_12a = 0;
    local_100 = &local_120;
    local_f8 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_12b);
    __l_08._M_len = local_f8;
    __l_08._M_array = local_100;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&(anonymous_namespace)::
              verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
              ::unbound_abi_cxx11_,__l_08,&local_12b);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_12b);
    local_848 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100;
    do {
      local_848 = local_848 + -1;
      std::__cxx11::string::~string((string *)local_848);
    } while (local_848 != &local_120);
    std::allocator<char>::~allocator(&local_129);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,
                 &(anonymous_namespace)::
                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                  ::unbound_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::unbound_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::parsedKeywords == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::parsedKeywords), iVar4 != 0)) {
    memcpy(local_2a0,&DAT_017cf970,0x160);
    local_138 = 0x16;
    local_140 = local_2a0;
    std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_2a1);
    __l_07._M_len = local_138;
    __l_07._M_array = local_140;
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::vector(&verifyResult::parsedKeywords,__l_07,&local_2a1);
    std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_2a1);
    __cxa_atexit(std::
                 vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::~vector,&verifyResult::parsedKeywords,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::parsedKeywords);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::func2map_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::func2map_abi_cxx11_), iVar4 != 0)) {
    local_3fe[1] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )0x1;
    local_330 = &local_328;
    local_382 = 1;
    local_380 = &local_378;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"foo",&local_381);
    local_382 = 0;
    local_358 = &local_378;
    local_350 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_383);
    __l_05._M_len = local_350;
    __l_05._M_array = local_358;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_348,__l_05,&local_383);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[8],_true>(&local_328,(char (*) [8])"FUNC_2a",&local_348);
    local_3fc[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )0x1;
    local_3f9._1_8_ = &local_3f0;
    local_330 = &local_2f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"bar",local_3f9);
    local_3f9._1_8_ = local_3d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_3d0,"zot",&local_3fa);
    local_3fc[1] = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )0x0;
    local_3b0 = &local_3f0;
    local_3a8 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(local_3fc);
    __l_04._M_len = local_3a8;
    __l_04._M_array = local_3b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_3a0,__l_04,local_3fc);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[8],_true>(&local_2f0,(char (*) [8])"FUNC_2b",&local_3a0);
    local_3fe[1] = (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )0x0;
    local_2b8 = &local_328;
    local_2b0 = 2;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::allocator(&local_3ff);
    __l_06._M_len = local_2b0;
    __l_06._M_array = local_2b8;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map(&(anonymous_namespace)::
           verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::func2map_abi_cxx11_,__l_06,local_3fe,&local_3ff);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~allocator(&local_3ff);
    local_8c0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_2b8;
    do {
      local_8c0 = local_8c0 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~pair(local_8c0);
    } while (local_8c0 != &local_328);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3a0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(local_3fc);
    local_8d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3b0;
    do {
      local_8d8 = local_8d8 + -1;
      std::__cxx11::string::~string((string *)local_8d8);
    } while (local_8d8 != &local_3f0);
    std::allocator<char>::~allocator(&local_3fa);
    std::allocator<char>::~allocator(local_3f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_348);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_383);
    local_8f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_358;
    do {
      local_8f0 = local_8f0 + -1;
      std::__cxx11::string::~string((string *)local_8f0);
    } while (local_8f0 != &local_378);
    std::allocator<char>::~allocator(&local_381);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::~map,&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::func2map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::func2map_abi_cxx11_);
  }
  if (((anonymous_namespace)::
       verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::func4map_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::func4map_abi_cxx11_), iVar4 != 0)) {
    local_555 = 1;
    local_488 = &local_480;
    local_4da = 1;
    local_4d8 = &local_4d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"foo",&local_4d9);
    local_4da = 0;
    local_4b0 = &local_4d0;
    local_4a8 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_4db);
    __l_02._M_len = local_4a8;
    __l_02._M_array = local_4b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4a0,__l_02,&local_4db);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[8],_true>(&local_480,(char (*) [8])"FUNC_4a",&local_4a0);
    local_553 = 1;
    local_550 = &local_548;
    local_488 = &local_448;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"bar",&local_551);
    local_550 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_528;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_528,"zot",&local_552);
    local_553 = 0;
    local_508 = &local_548;
    local_500 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_554);
    __l_01._M_len = local_500;
    __l_01._M_array = local_508;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4f8,__l_01,&local_554);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pair<const_char_(&)[8],_true>(&local_448,(char (*) [8])"FUNC_4b",&local_4f8);
    local_555 = 0;
    local_410 = &local_480;
    local_408 = 2;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)(local_568 + 0x11));
    __l_03._M_len = local_408;
    __l_03._M_array = local_410;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map(&(anonymous_namespace)::
           verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::func4map_abi_cxx11_,__l_03,&local_556,
          (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)(local_568 + 0x11));
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)(local_568 + 0x11));
    local_958 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_410;
    do {
      local_958 = local_958 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~pair(local_958);
    } while (local_958 != &local_480);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4f8);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_554);
    local_970 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_508;
    do {
      local_970 = local_970 + -1;
      std::__cxx11::string::~string((string *)local_970);
    } while (local_970 != &local_548);
    std::allocator<char>::~allocator(&local_552);
    std::allocator<char>::~allocator(&local_551);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4a0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_4db);
    local_988 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b0;
    do {
      local_988 = local_988 + -1;
      std::__cxx11::string::~string((string *)local_988);
    } while (local_988 != &local_4d0);
    std::allocator<char>::~allocator(&local_4d9);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::~map,&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::func4map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::func4map_abi_cxx11_);
  }
  if ((anonymous_namespace)::
      verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
      ::keywordErrors_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                 ::keywordErrors_abi_cxx11_);
    if (iVar4 != 0) {
      local_660 = &local_658;
      local_670 = (string_view)::cm::operator____s("STRING_1",8);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cm::static_string_view,_const_char_(&)[26],_true>
                (&local_658,(static_string_view *)&local_670,
                 (char (*) [26])"  missing required value\n");
      local_660 = &local_628;
      local_680 = (string_view)::cm::operator____s("STRING_6",8);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cm::static_string_view,_const_char_(&)[28],_true>
                (&local_628,(static_string_view *)&local_680,
                 (char (*) [28])"  empty string not allowed\n");
      local_660 = &local_5f8;
      local_690 = (string_view)::cm::operator____s("LIST_1",6);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cm::static_string_view,_const_char_(&)[26],_true>
                (&local_5f8,(static_string_view *)&local_690,
                 (char (*) [26])"  missing required value\n");
      local_660 = &local_5c8;
      local_6a0 = (string_view)::cm::operator____s("LIST_4",6);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cm::static_string_view,_const_char_(&)[26],_true>
                (&local_5c8,(static_string_view *)&local_6a0,
                 (char (*) [26])"  missing required value\n");
      local_660 = &local_598;
      local_6b0 = (string_view)::cm::operator____s("FUNC_0",6);
      std::
      pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<cm::static_string_view,_const_char_(&)[26],_true>
                (&local_598,(static_string_view *)&local_6b0,
                 (char (*) [26])"  missing required value\n");
      local_568._0_8_ = &local_658;
      local_568._8_8_ = (char *)0x5;
      std::
      allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_6b2);
      __l_00._M_len = local_568._8_8_;
      __l_00._M_array = (iterator)local_568._0_8_;
      std::
      map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&(anonymous_namespace)::
             verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
             ::keywordErrors_abi_cxx11_,__l_00,&local_6b1,&local_6b2);
      std::
      allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator(&local_6b2);
      local_a18 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_568;
      do {
        local_a18 = local_a18 + -1;
        std::
        pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_a18);
      } while (local_a18 != &local_658);
      __cxa_atexit(std::
                   map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&(anonymous_namespace)::
                           verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::keywordErrors_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::keywordErrors_abi_cxx11_);
    }
  }
  if ((anonymous_namespace)::
      verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
      ::unparsed_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                 ::unparsed_abi_cxx11_);
    if (iVar4 != 0) {
      __range1._2_1_ = 1;
      local_770 = &local_768;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_768,"pos2",(allocator<char> *)((long)&__range1 + 7));
      local_770 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_748;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_748,"bar",(allocator<char> *)((long)&__range1 + 6));
      local_770 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_728;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_728,"ign1",(allocator<char> *)((long)&__range1 + 5));
      local_770 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_708;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_708,"ign2",(allocator<char> *)((long)&__range1 + 4));
      local_770 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_6e8,"ign4",(allocator<char> *)((long)&__range1 + 3));
      __range1._2_1_ = 0;
      local_6c8 = &local_768;
      local_6c0 = 5;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&__range1 + 1));
      __l._M_len = local_6c0;
      __l._M_array = local_6c8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&(anonymous_namespace)::
                verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                ::unparsed_abi_cxx11_,__l,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&__range1 + 1));
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&__range1 + 1));
      local_a88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6c8;
      do {
        local_a88 = local_a88 + -1;
        std::__cxx11::string::~string((string *)local_a88);
      } while (local_a88 != &local_768);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 4));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 5));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 6));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,
                   &(anonymous_namespace)::
                    verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                    ::unparsed_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                           ::unparsed_abi_cxx11_);
    }
  }
  bVar1 = ArgumentParser::ParseResult::operator_cast_to_bool((ParseResult *)unparsedArguments_local)
  ;
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(!result) failed on line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xbd);
    std::operator<<(poVar5,"\n");
    result_local._7_1_ = false;
  }
  else if (((ulong)unparsedArguments_local[2].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(result.Option1) failed on line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xbf);
    std::operator<<(poVar5,"\n");
    result_local._7_1_ = false;
  }
  else if (((ulong)unparsedArguments_local[2].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start & 0x100) == 0) {
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "ASSERT_TRUE(result.String1.empty()) failed on line ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc2);
      std::operator<<(poVar5,"\n");
      result_local._7_1_ = false;
    }
    else {
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &unparsedArguments_local[3].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        __lhs = std::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&unparsedArguments_local[3].
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = std::operator==(__lhs,"foo");
        if (bVar1) {
          bVar1 = std::optional::operator_cast_to_bool
                            ((optional *)
                             &unparsedArguments_local[5].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
          if (bVar1) {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(!result.String3) failed on line ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc5);
            std::operator<<(poVar5,"\n");
            result_local._7_1_ = false;
          }
          else {
            uVar6 = std::__cxx11::string::empty();
            if ((uVar6 & 1) == 0) {
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(result.String4.empty()) failed on line ");
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc6);
              std::operator<<(poVar5,"\n");
              result_local._7_1_ = false;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&unparsedArguments_local[8].
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,"foo");
              if (bVar1) {
                uVar6 = std::__cxx11::string::empty();
                if ((uVar6 & 1) == 0) {
                  poVar5 = std::operator<<((ostream *)&std::cout,
                                           "ASSERT_TRUE(result.String6.empty()) failed on line ");
                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,200);
                  std::operator<<(poVar5,"\n");
                  result_local._7_1_ = false;
                }
                else {
                  bVar1 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::empty(unparsedArguments_local + 0xb);
                  if (bVar1) {
                    bVar1 = std::operator==(unparsedArguments_local + 0xc,
                                            &(anonymous_namespace)::
                                             verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                             ::foobar_abi_cxx11_);
                    if (bVar1) {
                      bVar1 = std::optional::operator_cast_to_bool
                                        ((optional *)(unparsedArguments_local + 0xd));
                      if (bVar1) {
                        pvVar7 = &std::
                                  optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                  ::operator*((optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                               *)(unparsedArguments_local + 0xd))->
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ;
                        bVar1 = std::operator==(pvVar7,&(anonymous_namespace)::
                                                                                                                
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::barfoo_abi_cxx11_);
                        if (bVar1) {
                          bVar1 = std::optional::operator_cast_to_bool
                                            ((optional *)
                                             &unparsedArguments_local[0xe].
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish);
                          if (bVar1) {
                            pvVar7 = &std::
                                      optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      ::operator->((
                                                  optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)&unparsedArguments_local[0xe].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ;
                            bVar1 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::empty(pvVar7);
                            if (bVar1) {
                              bVar1 = std::optional::operator_cast_to_bool
                                                ((optional *)
                                                 &unparsedArguments_local[0xf].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                );
                              if (bVar1) {
                                poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(!result.List5) failed on line ");
                                poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd0);
                                std::operator<<(poVar5,"\n");
                                result_local._7_1_ = false;
                              }
                              else {
                                bVar1 = std::optional::operator_cast_to_bool
                                                  ((optional *)(unparsedArguments_local + 0x11));
                                if (bVar1) {
                                  pvVar7 = &std::
                                            optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ::operator->((
                                                  optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)(unparsedArguments_local + 0x11))->
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ;
                                  bVar1 = std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::empty(pvVar7);
                                  if (bVar1) {
                                    bVar1 = std::
                                            vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ::empty((
                                                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)&unparsedArguments_local[0x12].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                    if (bVar1) {
                                      sVar8 = std::
                                              vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ::size((
                                                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)&unparsedArguments_local[0x13].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                      if (sVar8 == 1) {
                                        pvVar9 = std::
                                                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                 ::operator[]((
                                                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  *)&unparsedArguments_local[0x13].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,0);
                                        bVar1 = std::
                                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::empty(pvVar9);
                                        if (bVar1) {
                                          bVar1 = std::optional::operator_cast_to_bool
                                                            ((optional *)
                                                             &unparsedArguments_local[0x14].
                                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                          if (bVar1) {
                                            pvVar10 = std::
                                                  optional<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                  ::operator*((
                                                  optional<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                  *)&unparsedArguments_local[0x14].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                            sVar8 = std::
                                                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ::size(pvVar10);
                                            if (sVar8 == 2) {
                                              pvVar10 = std::
                                                  optional<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                  ::operator*((
                                                  optional<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                  *)&unparsedArguments_local[0x14].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                              pvVar9 = std::
                                                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ::operator[](pvVar10,0);
                                              bVar1 = std::operator==(pvVar9,&(anonymous_namespace)
                                                                              ::
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::foobar_abi_cxx11_);
                                              if (bVar1) {
                                                pvVar10 = std::
                                                  optional<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                  ::operator*((
                                                  optional<std::vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                  *)&unparsedArguments_local[0x14].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                                pvVar9 = std::
                                                  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ::operator[](pvVar10,1);
                                                bVar1 = std::operator==(pvVar9,&
                                                  (anonymous_namespace)::
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::barfoo_abi_cxx11_);
                                                if (bVar1) {
                                                  bVar1 = std::optional::operator_cast_to_bool
                                                                    ((optional *)
                                                                     &unparsedArguments_local[0x15].
                                                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  if (bVar1) {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(!result.Multi4) failed on line ");
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xdb);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  else {
                                                    _Var2 = std::operator==((
                                                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)(unparsedArguments_local + 0x17),
                                                  (char (*) [5])"pos0");
                                                  if (_Var2) {
                                                    bVar1 = std::optional::operator_cast_to_bool
                                                                      ((optional *)
                                                                       &unparsedArguments_local
                                                                        [0x18].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                                  if (bVar1) {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(!result.Pos1) failed on line ");
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xde);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  else {
                                                    bVar1 = std::optional::operator_cast_to_bool
                                                                      ((optional *)
                                                                       &unparsedArguments_local
                                                                        [0x1a].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
                                                  if (bVar1) {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(!result.Pos2) failed on line ");
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xdf);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  else if (((ulong)unparsedArguments_local[0x1c].
                                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start & 1) ==
                                                  0) {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&unparsedArguments_local[0x1c].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,"foo");
                                                  if (bVar1) {
                                                    bVar1 = std::operator==((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                  *)&unparsedArguments_local[0x1d].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,&(anonymous_namespace)::
                                                                                                        
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::func2map_abi_cxx11_);
                                                  if (bVar1) {
                                                    bVar1 = std::operator==((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&unparsedArguments_local[0x1f].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,&(anonymous_namespace)::
                                                                                                        
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::foobar_abi_cxx11_);
                                                  if (bVar1) {
                                                    bVar1 = std::operator==((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                                  *)&unparsedArguments_local[0x20].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,&(anonymous_namespace)::
                                                                                                        
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::func4map_abi_cxx11_);
                                                  if (bVar1) {
                                                    bVar1 = std::operator==((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_20,
                                                  &(anonymous_namespace)::
                                                                                                      
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::unparsed_abi_cxx11_);
                                                  if (bVar1) {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&unparsedArguments_local[0x22].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,"unbound");
                                                  if (bVar1) {
                                                    bVar1 = std::operator==(unparsedArguments_local
                                                                            + 0x24,&
                                                  (anonymous_namespace)::
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::unbound_abi_cxx11_);
                                                  if (bVar1) {
                                                    bVar1 = std::operator==(unparsedArguments_local
                                                                            + 0x25,&
                                                  (anonymous_namespace)::
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::unbound_abi_cxx11_);
                                                  if (bVar1) {
                                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(unparsedArguments_local + 0x26),"unbound");
                                                  if (bVar1) {
                                                    bVar1 = std::operator==((
                                                  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                                  *)&unparsedArguments_local[0x27].
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,
                                                  &verifyResult::parsedKeywords);
                                                  if (bVar1) {
                                                    pmVar11 = ArgumentParser::ParseResult::
                                                              GetKeywordErrors_abi_cxx11_
                                                                        ((ParseResult *)
                                                                         unparsedArguments_local);
                                                    sVar12 = std::
                                                  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::size(pmVar11);
                                                  sVar13 = std::
                                                  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::size(&(anonymous_namespace)::
                                                                                                                    
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::keywordErrors_abi_cxx11_);
                                                  if (sVar12 == sVar13) {
                                                    pmVar11 = ArgumentParser::ParseResult::
                                                              GetKeywordErrors_abi_cxx11_
                                                                        ((ParseResult *)
                                                                         unparsedArguments_local);
                                                    __end1 = std::
                                                  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::begin(pmVar11);
                                                  ke = (
                                                  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)std::
                                                  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::end(pmVar11);
                                                  while( true ) {
                                                    bVar1 = std::operator!=(&__end1,(_Self *)&ke);
                                                    if (!bVar1) break;
                                                    ki._M_node = (_Base_ptr)
                                                                 std::
                                                  _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator*(&__end1);
                                                  local_7a0._M_node =
                                                       (_Base_ptr)
                                                       std::
                                                  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::find(&(anonymous_namespace)::
                                                                                                                    
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::keywordErrors_abi_cxx11_,(key_type *)ki._M_node)
                                                  ;
                                                  local_7a8._M_node =
                                                       (_Base_ptr)
                                                       std::
                                                  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::end(&(anonymous_namespace)::
                                                                                                                  
                                                  verifyResult((anonymous_namespace)::Result_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                                  ::keywordErrors_abi_cxx11_);
                                                  bVar1 = std::operator!=(&local_7a0,&local_7a8);
                                                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(ki != keywordErrors.end()) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xf3);
                                                  std::operator<<(poVar5,"\n");
                                                  return false;
                                                  }
                                                  __lhs_00 = &(ki._M_node)->_M_left;
                                                  ppVar14 = std::
                                                  _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator->(&local_7a0);
                                                  _Var3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)__lhs_00,&ppVar14->second);
                                                  if (!_Var3) {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(ke.second == ki->second) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xf4);
                                                  std::operator<<(poVar5,"\n");
                                                  return false;
                                                  }
                                                  std::
                                                  _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator++(&__end1);
                                                  }
                                                  result_local._7_1_ = true;
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.GetKeywordErrors().size() == keywordErrors.size()) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xf0);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.ParsedKeywords == parsedKeywords) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xee);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.UnboundNonEmptyStr == \"unbound\") failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xec);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.UnboundNonEmpty == unbound) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xeb);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.UnboundMaybeEmpty == unbound) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xea);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.UnboundMaybe == \"unbound\") failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xe9);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(unparsedArguments == unparsed) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xe7);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.Func4_ == func4map) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xe5);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.Func3_ == foobar) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xe4);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.Func2_ == func2map) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xe3);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.Func1_ == \"foo\") failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xe2);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.Func0_ == false) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xe1);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                          
                                                  "ASSERT_TRUE(result.Pos0 == \"pos0\") failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xdd);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                  }
                                                  }
                                                }
                                                else {
                                                  poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                      
                                                  "ASSERT_TRUE((*result.Multi3)[1] == barfoo) failed on line "
                                                  );
                                                  poVar5 = (ostream *)
                                                           std::ostream::operator<<(poVar5,0xda);
                                                  std::operator<<(poVar5,"\n");
                                                  result_local._7_1_ = false;
                                                }
                                              }
                                              else {
                                                poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                  
                                                  "ASSERT_TRUE((*result.Multi3)[0] == foobar) failed on line "
                                                  );
                                                poVar5 = (ostream *)
                                                         std::ostream::operator<<(poVar5,0xd9);
                                                std::operator<<(poVar5,"\n");
                                                result_local._7_1_ = false;
                                              }
                                            }
                                            else {
                                              poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                              
                                                  "ASSERT_TRUE((*result.Multi3).size() == 2) failed on line "
                                                  );
                                              poVar5 = (ostream *)
                                                       std::ostream::operator<<(poVar5,0xd8);
                                              std::operator<<(poVar5,"\n");
                                              result_local._7_1_ = false;
                                            }
                                          }
                                          else {
                                            poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                          
                                                  "ASSERT_TRUE(result.Multi3) failed on line ");
                                            poVar5 = (ostream *)
                                                     std::ostream::operator<<(poVar5,0xd7);
                                            std::operator<<(poVar5,"\n");
                                            result_local._7_1_ = false;
                                          }
                                        }
                                        else {
                                          poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                      
                                                  "ASSERT_TRUE(result.Multi2[0].empty()) failed on line "
                                                  );
                                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd6);
                                          std::operator<<(poVar5,"\n");
                                          result_local._7_1_ = false;
                                        }
                                      }
                                      else {
                                        poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                                  
                                                  "ASSERT_TRUE(result.Multi2.size() == 1) failed on line "
                                                  );
                                        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd5);
                                        std::operator<<(poVar5,"\n");
                                        result_local._7_1_ = false;
                                      }
                                    }
                                    else {
                                      poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                              
                                                  "ASSERT_TRUE(result.Multi1.empty()) failed on line "
                                                  );
                                      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd4);
                                      std::operator<<(poVar5,"\n");
                                      result_local._7_1_ = false;
                                    }
                                  }
                                  else {
                                    poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(result.List6->empty()) failed on line "
                                                  );
                                    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd2);
                                    std::operator<<(poVar5,"\n");
                                    result_local._7_1_ = false;
                                  }
                                }
                                else {
                                  poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                                      
                                                  "ASSERT_TRUE(result.List6) failed on line ");
                                  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xd1);
                                  std::operator<<(poVar5,"\n");
                                  result_local._7_1_ = false;
                                }
                              }
                            }
                            else {
                              poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                              
                                                  "ASSERT_TRUE(result.List4->empty()) failed on line "
                                                  );
                              poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xcf);
                              std::operator<<(poVar5,"\n");
                              result_local._7_1_ = false;
                            }
                          }
                          else {
                            poVar5 = std::operator<<((ostream *)&std::cout,
                                                     "ASSERT_TRUE(result.List4) failed on line ");
                            poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xce);
                            std::operator<<(poVar5,"\n");
                            result_local._7_1_ = false;
                          }
                        }
                        else {
                          poVar5 = std::operator<<((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(*result.List3 == barfoo) failed on line "
                                                  );
                          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xcd);
                          std::operator<<(poVar5,"\n");
                          result_local._7_1_ = false;
                        }
                      }
                      else {
                        poVar5 = std::operator<<((ostream *)&std::cout,
                                                 "ASSERT_TRUE(result.List3) failed on line ");
                        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xcc);
                        std::operator<<(poVar5,"\n");
                        result_local._7_1_ = false;
                      }
                    }
                    else {
                      poVar5 = std::operator<<((ostream *)&std::cout,
                                               "ASSERT_TRUE(result.List2 == foobar) failed on line "
                                              );
                      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xcb);
                      std::operator<<(poVar5,"\n");
                      result_local._7_1_ = false;
                    }
                  }
                  else {
                    poVar5 = std::operator<<((ostream *)&std::cout,
                                             "ASSERT_TRUE(result.List1.empty()) failed on line ");
                    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xca);
                    std::operator<<(poVar5,"\n");
                    result_local._7_1_ = false;
                  }
                }
              }
              else {
                poVar5 = std::operator<<((ostream *)&std::cout,
                                         "ASSERT_TRUE(result.String5 == \"foo\") failed on line ");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,199);
                std::operator<<(poVar5,"\n");
                result_local._7_1_ = false;
              }
            }
          }
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(*result.String2 == \"foo\") failed on line ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc4);
          std::operator<<(poVar5,"\n");
          result_local._7_1_ = false;
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(result.String2) failed on line "
                                );
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc3);
        std::operator<<(poVar5,"\n");
        result_local._7_1_ = false;
      }
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(!result.Option2) failed on line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xc0);
    std::operator<<(poVar5,"\n");
    result_local._7_1_ = false;
  }
  return result_local._7_1_;
}

Assistant:

bool verifyResult(Result const& result,
                  std::vector<std::string> const& unparsedArguments)
{
  static std::vector<std::string> const foobar = { "foo", "bar" };
  static std::vector<std::string> const barfoo = { "bar", "foo" };
  static std::vector<std::string> const unbound = { "unbound" };
  static std::vector<cm::string_view> const parsedKeywords = {
    /* clang-format off */
    "OPTION_1",
    "STRING_1",
    "STRING_2",
    "STRING_4",
    "STRING_5",
    "STRING_6",
    "LIST_1",
    "LIST_2",
    "LIST_3",
    "LIST_3",
    "LIST_4",
    "LIST_6",
    "MULTI_2",
    "MULTI_3",
    "MULTI_3",
    "FUNC_0",
    "FUNC_1",
    "FUNC_2a",
    "FUNC_2b",
    "FUNC_3",
    "FUNC_4a",
    "FUNC_4b",
    /* clang-format on */
  };
  static std::map<std::string, std::vector<std::string>> const func2map = {
    { "FUNC_2a", { "foo" } }, { "FUNC_2b", { "bar", "zot" } }
  };
  static std::map<std::string, std::vector<std::string>> const func4map = {
    { "FUNC_4a", { "foo" } }, { "FUNC_4b", { "bar", "zot" } }
  };
  static std::map<cm::string_view, std::string> const keywordErrors = {
    { "STRING_1"_s, "  missing required value\n" },
    { "STRING_6"_s, "  empty string not allowed\n" },
    { "LIST_1"_s, "  missing required value\n" },
    { "LIST_4"_s, "  missing required value\n" },
    { "FUNC_0"_s, "  missing required value\n" }
  };
  static std::vector<std::string> const unparsed = { "pos2", "bar", "ign1",
                                                     "ign2", "ign4" };

#define ASSERT_TRUE(x)                                                        \
  do {                                                                        \
    if (!(x)) {                                                               \
      std::cout << "ASSERT_TRUE(" #x ") failed on line " << __LINE__ << "\n"; \
      return false;                                                           \
    }                                                                         \
  } while (false)

  ASSERT_TRUE(!result);

  ASSERT_TRUE(result.Option1);
  ASSERT_TRUE(!result.Option2);

  ASSERT_TRUE(result.String1.empty());
  ASSERT_TRUE(result.String2);
  ASSERT_TRUE(*result.String2 == "foo");
  ASSERT_TRUE(!result.String3);
  ASSERT_TRUE(result.String4.empty());
  ASSERT_TRUE(result.String5 == "foo");
  ASSERT_TRUE(result.String6.empty());

  ASSERT_TRUE(result.List1.empty());
  ASSERT_TRUE(result.List2 == foobar);
  ASSERT_TRUE(result.List3);
  ASSERT_TRUE(*result.List3 == barfoo);
  ASSERT_TRUE(result.List4);
  ASSERT_TRUE(result.List4->empty());
  ASSERT_TRUE(!result.List5);
  ASSERT_TRUE(result.List6);
  ASSERT_TRUE(result.List6->empty());

  ASSERT_TRUE(result.Multi1.empty());
  ASSERT_TRUE(result.Multi2.size() == 1);
  ASSERT_TRUE(result.Multi2[0].empty());
  ASSERT_TRUE(result.Multi3);
  ASSERT_TRUE((*result.Multi3).size() == 2);
  ASSERT_TRUE((*result.Multi3)[0] == foobar);
  ASSERT_TRUE((*result.Multi3)[1] == barfoo);
  ASSERT_TRUE(!result.Multi4);

  ASSERT_TRUE(result.Pos0 == "pos0");
  ASSERT_TRUE(!result.Pos1);
  ASSERT_TRUE(!result.Pos2);

  ASSERT_TRUE(result.Func0_ == false);
  ASSERT_TRUE(result.Func1_ == "foo");
  ASSERT_TRUE(result.Func2_ == func2map);
  ASSERT_TRUE(result.Func3_ == foobar);
  ASSERT_TRUE(result.Func4_ == func4map);

  ASSERT_TRUE(unparsedArguments == unparsed);

  ASSERT_TRUE(result.UnboundMaybe == "unbound");
  ASSERT_TRUE(result.UnboundMaybeEmpty == unbound);
  ASSERT_TRUE(result.UnboundNonEmpty == unbound);
  ASSERT_TRUE(result.UnboundNonEmptyStr == "unbound");

  ASSERT_TRUE(result.ParsedKeywords == parsedKeywords);

  ASSERT_TRUE(result.GetKeywordErrors().size() == keywordErrors.size());
  for (auto const& ke : result.GetKeywordErrors()) {
    auto const ki = keywordErrors.find(ke.first);
    ASSERT_TRUE(ki != keywordErrors.end());
    ASSERT_TRUE(ke.second == ki->second);
  }

  return true;
}